

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spi_failure_tests.cpp
# Opt level: O1

void __thiscall
iu_SPIExpectFailureTest_x_iutest_x_Different_Test::Body
          (iu_SPIExpectFailureTest_x_iutest_x_Different_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  TestFlag *pTVar2;
  Variable *pVVar3;
  AssertionResult iutest_spi_ar;
  SPIFailureChecker iutest_failure_checker;
  allocator<char> local_1f9;
  AssertionHelper local_1f8;
  AssertionResult local_1c8;
  undefined1 local_1a0 [16];
  TestPartResultReporterInterface *local_190;
  vector<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_> local_188;
  Type local_170;
  ios_base local_120 [264];
  
  iutest::detail::NewTestPartResultCheckHelper::Collector<iutest::detail::NoTestPartResultReporter>
  ::Collector((Collector<iutest::detail::NoTestPartResultReporter> *)local_1a0);
  local_1a0._0_8_ = &PTR__Collector_0013c3e8;
  local_170 = kFatalFailure;
  iutest::detail::ScopedSPITestFlag::ScopedSPITestFlag((ScopedSPITestFlag *)&local_1f8);
  NonFatalFailure1();
  paVar1 = &local_1f8.m_part_result.super_iuCodeMessage.m_message.field_2;
  pTVar2 = iutest::TestFlag::GetInstance();
  pTVar2->m_test_flags = (int)local_1f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p
  ;
  local_1f8.m_part_result.super_iuCodeMessage.m_message._M_string_length = 0;
  local_1f8.m_part_result.super_iuCodeMessage.m_message.field_2._M_local_buf[0] = '\0';
  local_1f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p = (pointer)paVar1;
  iutest::detail::SPIFailureChecker::GetResult
            (&local_1c8,(SPIFailureChecker *)local_1a0,(string *)&local_1f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
    operator_delete(local_1f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                    CONCAT71(local_1f8.m_part_result.super_iuCodeMessage.m_message.field_2.
                             _M_allocated_capacity._1_7_,
                             local_1f8.m_part_result.super_iuCodeMessage.m_message.field_2.
                             _M_local_buf[0]) + 1);
  }
  local_1a0._0_8_ = &PTR__Collector_0013c468;
  std::vector<iutest::TestPartResult,_std::allocator<iutest::TestPartResult>_>::~vector(&local_188);
  local_1a0._8_8_ = &PTR__ReporterHolder_0013c490;
  pVVar3 = iutest::TestEnv::get_vars();
  pVVar3->m_testpartresult_reporter = local_190;
  if (local_1c8.m_result == false) {
    memset((iu_global_format_stringstream *)local_1a0,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_1a0);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1f8,local_1c8.m_message._M_dataplus._M_p,&local_1f9);
    local_1f8.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/spi_failure_tests.cpp"
    ;
    local_1f8.m_part_result.super_iuCodeMessage.m_line = 0x60;
    local_1f8.m_part_result.super_iuCodeMessage._44_4_ = 1;
    iutest::AssertionHelper::OnFixed(&local_1f8,(Fixed *)local_1a0,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(local_1f8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p,
                      CONCAT71(local_1f8.m_part_result.super_iuCodeMessage.m_message.field_2.
                               _M_allocated_capacity._1_7_,
                               local_1f8.m_part_result.super_iuCodeMessage.m_message.field_2.
                               _M_local_buf[0]) + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_1a0);
    std::ios_base::~ios_base(local_120);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8.m_message._M_dataplus._M_p != &local_1c8.m_message.field_2) {
    operator_delete(local_1c8.m_message._M_dataplus._M_p,
                    local_1c8.m_message.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

IUTEST(SPIExpectFailureTest, Different)
{
    IUTEST_EXPECT_FATAL_FAILURE(NonFatalFailure1(); , "");
}